

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

ssize_t __thiscall
FIX::ThreadedSocketConnection::read
          (ThreadedSocketConnection *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  size_t len;
  SocketRecvFailed *pSVar2;
  undefined8 extraout_RAX;
  SocketRecvFailed *e;
  ssize_t size;
  undefined1 auStack_a8 [4];
  int result;
  fd_set readset;
  timeval timeout;
  ThreadedSocketConnection *this_local;
  
  readset.fds_bits[0xf] = 1;
  readset.fds_bits[0xd] = (this->m_fds).fds_bits[0xe];
  readset.fds_bits[0xe] = (this->m_fds).fds_bits[0xf];
  readset.fds_bits[0xb] = (this->m_fds).fds_bits[0xc];
  readset.fds_bits[0xc] = (this->m_fds).fds_bits[0xd];
  readset.fds_bits[9] = (this->m_fds).fds_bits[10];
  readset.fds_bits[10] = (this->m_fds).fds_bits[0xb];
  readset.fds_bits[7] = (this->m_fds).fds_bits[8];
  readset.fds_bits[8] = (this->m_fds).fds_bits[9];
  _auStack_a8 = (this->m_fds).fds_bits[0];
  readset.fds_bits[0] = (this->m_fds).fds_bits[1];
  readset.fds_bits[1] = (this->m_fds).fds_bits[2];
  readset.fds_bits[2] = (this->m_fds).fds_bits[3];
  readset.fds_bits[3] = (this->m_fds).fds_bits[4];
  readset.fds_bits[4] = (this->m_fds).fds_bits[5];
  readset.fds_bits[5] = (this->m_fds).fds_bits[6];
  readset.fds_bits[6] = (this->m_fds).fds_bits[7];
  iVar1 = select(this->m_socket + 1,(fd_set *)auStack_a8,(fd_set *)0x0,(fd_set *)0x0,
                 (timeval *)(readset.fds_bits + 0xf));
  if (iVar1 < 1) {
    if ((iVar1 == 0) && (this->m_pSession != (Session *)0x0)) {
      Session::next(this->m_pSession);
    }
    else if (iVar1 < 0) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,(long)iVar1);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
  }
  else {
    len = socket_recv(this->m_socket,this->m_buffer,0x2000);
    if ((long)len < 1) {
      pSVar2 = (SocketRecvFailed *)__cxa_allocate_exception(0x50);
      SocketRecvFailed::SocketRecvFailed(pSVar2,len);
      __cxa_throw(pSVar2,&SocketRecvFailed::typeinfo,SocketRecvFailed::~SocketRecvFailed);
    }
    Parser::addToStream(&this->m_parser,this->m_buffer,len);
  }
  processStream(this);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool ThreadedSocketConnection::read()
{
  struct timeval timeout = { 1, 0 };
  fd_set readset = m_fds;

  try
  {
    // Wait for input (1 second timeout)
    int result = select( 1 + m_socket, &readset, 0, 0, &timeout );

    if( result > 0 ) // Something to read
    {
      // We can read without blocking
      ssize_t size = socket_recv( m_socket, m_buffer, sizeof(m_buffer) );
      if ( size <= 0 ) { throw SocketRecvFailed( size ); }
      m_parser.addToStream( m_buffer, size );
    }
    else if( result == 0 && m_pSession ) // Timeout
    {
      m_pSession->next();
    }
    else if( result < 0 ) // Error
    {
      throw SocketRecvFailed( result );
    }

    processStream();
    return true;
  }
  catch ( SocketRecvFailed& e )
  {
    if( m_disconnect )
      return false;

    if( m_pSession )
    {
      m_pSession->getLog()->onEvent( e.what() );
      m_pSession->disconnect();
    }
    else
    {
      disconnect();
    }

    return false;
  }
}